

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Hpipe::Context::write_to_stream(Context *this,ostream *os)

{
  uint uVar1;
  _Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> local_30;
  
  std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::vector
            ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)&local_30,
             (vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)this);
  PointedValues<Hpipe::Vec<const_Hpipe::CharItem_*>_>::write_to_stream
            ((PointedValues<Hpipe::Vec<const_Hpipe::CharItem_*>_> *)&local_30,os);
  std::_Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::
  ~_Vector_base(&local_30);
  uVar1 = this->flags;
  if ((uVar1 & 1) != 0) {
    std::operator<<(os," BEG");
    uVar1 = this->flags;
  }
  if ((uVar1 & 2) != 0) {
    std::operator<<(os," EOF");
    uVar1 = this->flags;
  }
  if ((uVar1 & 4) != 0) {
    std::operator<<(os," NOT_EOF");
  }
  return;
}

Assistant:

void Context::write_to_stream( std::ostream &os ) const {
    os << pointed_values( pos );
    if ( beg() )
        os << " BEG";
    if ( eof() )
        os << " EOF";
    if ( not_eof() )
        os << " NOT_EOF";
}